

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  uint errcode;
  CallInfo *pCVar3;
  StkId level;
  
  if (from == (lua_State *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = from->nCcalls + 1;
  }
  uVar1 = L->nny;
  L->nCcalls = uVar2;
  L->nny = 0;
  errcode = luaD_rawrunprotected(L,resume,L->top + -(long)nargs);
  if (errcode == 0xffffffff) {
    errcode = 2;
  }
  else {
    while (1 < errcode) {
      pCVar3 = L->ci;
      while( true ) {
        if (pCVar3 == (CallInfo *)0x0) {
          L->status = (lu_byte)errcode;
          seterrorobj(L,errcode,L->top);
          L->ci->top = L->top;
          goto LAB_00108deb;
        }
        if ((pCVar3->callstatus & 0x10) != 0) break;
        pCVar3 = pCVar3->previous;
      }
      level = (StkId)((long)&L->stack->value_ + pCVar3->extra);
      luaF_close(L,level);
      seterrorobj(L,errcode,level);
      L->ci = pCVar3;
      L->allowhook = (pCVar3->u).c.old_allowhook;
      L->nny = 0;
      luaD_shrinkstack(L);
      L->errfunc = (pCVar3->u).c.old_errfunc;
      pCVar3->callstatus = pCVar3->callstatus | 0x20;
      (pCVar3->u).c.status = (lu_byte)errcode;
      errcode = luaD_rawrunprotected(L,unroll,(void *)0x0);
    }
  }
LAB_00108deb:
  L->nny = uVar1;
  L->nCcalls = L->nCcalls - 1;
  return errcode;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  int oldnny = L->nny;  /* save 'nny' */
  lua_lock(L);
  luai_userstateresume(L, nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, L->top - nargs);
  if (status == -1)  /* error calling 'lua_resume'? */
    status = LUA_ERRRUN;
  else {  /* yield or regular error */
    while (status != LUA_OK && status != LUA_YIELD) {  /* error? */
      if (recover(L, status))  /* recover point? */
        status = luaD_rawrunprotected(L, unroll, NULL);  /* run continuation */
      else {  /* unrecoverable error */
        L->status = cast_byte(status);  /* mark thread as `dead' */
        seterrorobj(L, status, L->top);
        L->ci->top = L->top;
        break;
      }
    }
    lua_assert(status == L->status);
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}